

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
           *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_930;
  TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> local_910;
  
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_930);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZTriangleSphere
            (&local_910);
  iVar3 = pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::ClassId
                    (&local_910);
  local_910.super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
  super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable._vptr_TPZSavable =
       (TPZSavable)&PTR__TPZTriangleSphere_018a9ae8;
  local_910.fXc._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_910.fXc.fStore != (double *)0x0) {
    operator_delete__(local_910.fXc.fStore);
  }
  local_910.super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
  super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable._vptr_TPZSavable =
       (TPZSavable)&PTR__TPZGeoBlend_018aa468;
  lVar4 = 0x720;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_910.super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
                      super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != -0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}